

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_obj.c
# Opt level: O3

_outlet * outlet_new(t_object *owner,t_symbol *s)

{
  _outlet *p_Var1;
  _outlet *p_Var2;
  _outlet **pp_Var3;
  t_pd *pp_Var4;
  _outconnect *p_Var5;
  _outlet *p_Var6;
  
  p_Var2 = (_outlet *)getbytes(0x20);
  p_Var2->o_owner = owner;
  p_Var2->o_next = (_outlet *)0x0;
  p_Var1 = owner->te_outlet;
  if (owner->te_outlet == (_outlet *)0x0) {
    pp_Var3 = &owner->te_outlet;
  }
  else {
    do {
      p_Var6 = p_Var1;
      p_Var1 = p_Var6->o_next;
    } while (p_Var1 != (_outlet *)0x0);
    pp_Var3 = &p_Var6->o_next;
  }
  *pp_Var3 = p_Var2;
  if (backtracer_cantrace == 0) {
    p_Var5 = (_outconnect *)0x0;
  }
  else {
    pp_Var4 = pd_new(backtracer_class);
    pp_Var4[1] = (t_pd)0x0;
    pp_Var4[2] = (t_pd)owner;
    p_Var5 = (_outconnect *)getbytes(0x10);
    p_Var5->oc_next = (_outconnect *)0x0;
    p_Var5->oc_to = pp_Var4;
  }
  p_Var2->o_connections = p_Var5;
  p_Var2->o_sym = s;
  return p_Var2;
}

Assistant:

t_outlet *outlet_new(t_object *owner, t_symbol *s)
{
    t_outlet *x = (t_outlet *)getbytes(sizeof(*x)), *y, *y2;
    x->o_owner = owner;
    x->o_next = 0;
    if ((y = owner->ob_outlet))
    {
        while ((y2 = y->o_next)) y = y2;
        y->o_next = x;
    }
    else owner->ob_outlet = x;
    if (backtracer_cantrace)
    {
        t_backtracer *b = backtracer_new(&owner->ob_pd);
        x->o_connections =  (t_outconnect *)t_getbytes(sizeof(t_outconnect));
        x->o_connections->oc_next = 0;
        x->o_connections->oc_to = &b->b_pd;
    }
    else x->o_connections = 0;
    x->o_sym = s;
    return (x);
}